

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10Texture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen10TextureCalc::FillTexPlanar
          (GmmGen10TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  GMM_RESOURCE_FORMAT GVar1;
  uint uVar2;
  anon_struct_8_45_9b07292e_for_Gpu aVar3;
  PlatformInfo *pPVar4;
  uint uVar5;
  bool bVar6;
  uint32_t uVar7;
  uint uVar8;
  GMM_STATUS GVar9;
  GMM_STATUS GVar10;
  anon_struct_8_44_94931171_for_Info aVar11;
  anon_struct_8_44_94931171_for_Info aVar12;
  uint uVar13;
  uint uVar14;
  GMM_GFX_SIZE_T GVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint local_38;
  undefined4 local_34;
  uint32_t WidthBytesPhysical;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  pTexInfo->TileMode = TILE_NONE;
  aVar11 = (anon_struct_8_44_94931171_for_Info)
           GmmGetPlatformInfo((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext);
  uVar14 = pTexInfo->BitsPerPixel * (int)pTexInfo->BaseWidth;
  local_38 = uVar14 >> 3;
  GVar1 = pTexInfo->Format;
  uVar17 = pTexInfo->BaseHeight;
  aVar12 = aVar11;
  switch(GVar1) {
  case GMM_FORMAT_I420:
  case GMM_FORMAT_IYUV:
  case GMM_FORMAT_YV12:
  case GMM_FORMAT_YVU9:
    bVar6 = GVar1 == GMM_FORMAT_YVU9;
    uVar13 = (uint)!bVar6 * 2 | 0xfffffffc;
    uVar13 = ((uVar17 + 1 + (uint)bVar6 * 2 & uVar13) * (local_38 + 1 + (uint)bVar6 * 2 & uVar13) >>
             bVar6 * '\x02' + 2) * 2;
    if (7 < uVar14) {
      uVar13 = ((uVar13 - 1) + local_38 * uVar17 + local_38) / local_38;
    }
    (pTexInfo->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(pTexInfo->Flags).Info & 0xffffff87fff7ffff | 0x80000);
    local_34 = 0;
    uVar7 = 1;
    uVar14 = 0;
    goto LAB_001b3a5c;
  case GMM_FORMAT_IMC1:
  case GMM_FORMAT_IMC3:
  case GMM_FORMAT_MFX_JPEG_YUV420:
  case GMM_FORMAT_MFX_JPEG_YUV422V:
    uVar14 = uVar17 + 1 >> 1;
    break;
  case GMM_FORMAT_IMC2:
  case GMM_FORMAT_IMC4:
    uVar17 = uVar17 + 0xf & 0xfffffff0;
    uVar14 = uVar17 >> 1;
    local_38 = local_38 + 1 & 0xfffffffe;
    uVar13 = uVar14 + uVar17;
    goto LAB_001b3a52;
  case GMM_FORMAT_L4A4:
  case GMM_FORMAT_P8:
  case GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM:
  case GMM_FORMAT_R24G8_TYPELESS:
  case GMM_FORMAT_R32G8X24_TYPELESS:
  case GMM_FORMAT_RENDER_8BIT:
  case GMM_FORMAT_Y1_UNORM:
  case GMM_FORMAT_Y8_UNORM_VA:
  case GMM_FORMAT_Y16_SNORM:
  case GMM_FORMAT_Y16_UNORM:
  case GMM_FORMAT_Y32_UNORM:
  case GMM_FORMAT_Y210:
  case GMM_FORMAT_Y212:
  case GMM_FORMAT_Y410:
  case GMM_FORMAT_Y412:
  case GMM_FORMAT_Y216:
  case GMM_FORMAT_Y416:
  case GMM_FORMAT_UYVY_2x1:
  case GMM_FORMAT_VYUY_2x1:
  case GMM_FORMAT_YUY2_2x1:
  case GMM_FORMAT_YVYU_2x1:
  case GMM_FORMAT_MEDIA_Y1_UNORM:
  case GMM_FORMAT_MEDIA_Y8_UNORM:
  case GMM_FORMAT_MEDIA_Y16_SNORM:
  case GMM_FORMAT_MEDIA_Y16_UNORM:
  case GMM_FORMAT_MEDIA_Y32_UNORM:
  case GMM_FORMAT_B16G16R16A16_UNORM:
    return GMM_ERROR;
  case GMM_FORMAT_MFX_JPEG_YUV411R:
    uVar14 = uVar17 + 3 >> 2;
    break;
  case GMM_FORMAT_NV11:
  case GMM_FORMAT_P208:
  case GMM_FORMAT_P216:
    uVar13 = uVar17 * 2;
    uVar14 = uVar17;
    goto LAB_001b39bc;
  case GMM_FORMAT_NV12:
  case GMM_FORMAT_NV21:
  case GMM_FORMAT_P010:
  case GMM_FORMAT_P012:
  case GMM_FORMAT_P016:
    uVar14 = uVar17 + 1 >> 1;
    uVar13 = uVar14 + uVar17;
LAB_001b39bc:
    if ((GVar1 - GMM_FORMAT_NV12 < 0x24) &&
       ((0x80000007bU >> ((ulong)(GVar1 - GMM_FORMAT_NV12) & 0x3f) & 1) != 0)) {
      local_38 = local_38 + 1 & 0xfffffffe;
    }
    else {
      aVar12 = (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffff87fff7ffff | 0x80000);
      (pTexInfo->Flags).Info = aVar12;
    }
LAB_001b3a52:
    local_34 = (undefined4)CONCAT71(aVar12._1_7_,1);
    uVar7 = 2;
    goto LAB_001b3a5c;
  default:
    if (GVar1 != GMM_FORMAT_BGRP) {
      return GMM_ERROR;
    }
  case GMM_FORMAT_MFX_JPEG_YUV411:
  case GMM_FORMAT_MFX_JPEG_YUV422H:
  case GMM_FORMAT_MFX_JPEG_YUV444:
  case GMM_FORMAT_RGBP:
    uVar14 = uVar17 + 0xf & 0xfffffff0;
    uVar13 = uVar14 * 3;
    uVar7 = 3;
    local_34 = 0;
    uVar17 = uVar14;
    goto LAB_001b3a5c;
  }
  uVar14 = uVar14 + 0xf & 0xfffffff0;
  uVar17 = uVar17 + 0xf & 0xfffffff0;
  uVar13 = uVar17 + uVar14 * 2;
  uVar7 = 3;
  local_34 = 0;
LAB_001b3a5c:
  (pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes = uVar7;
  GmmTextureCalc::SetTileMode((GmmTextureCalc *)this,pTexInfo);
  aVar3 = (pTexInfo->Flags).Gpu;
  if (((aVar3._0_4_ >> 0x10 & 1) != 0) && (((ulong)(pTexInfo->Flags).Info & 0x7000000000) == 0)) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar3 & 0xfffffffffffeffff);
  }
  if ((((pTexInfo->Flags).Info.field_0x2 & 8) != 0) && (((uint)(pTexInfo->Flags).Wa & 0x10) == 0)) {
    uVar18 = pRestrictions->PitchAlignment;
    uVar2 = pRestrictions->RenderPitchAlignment;
    uVar8 = pRestrictions->LockPitchAlignment;
    uVar5 = pRestrictions->MinPitch;
    pRestrictions->PitchAlignment = (uint)(uVar18 < 0x40) * 0x40 | (uVar18 >= 0x40) * uVar18;
    pRestrictions->RenderPitchAlignment = (uint)(uVar2 < 0x40) * 0x40 | (uVar2 >= 0x40) * uVar2;
    pRestrictions->LockPitchAlignment = (uint)(uVar8 < 0x40) * 0x40 | (uVar8 >= 0x40) * uVar8;
    pRestrictions->MinPitch = (uint)(uVar5 < 0x40) * 0x40 | (uVar5 >= 0x40) * uVar5;
  }
  uVar18 = pTexInfo->Format - GMM_FORMAT_I420;
  if ((uVar18 < 0x27) && ((0x6000002003U >> ((ulong)uVar18 & 0x3f) & 1) != 0)) {
    pRestrictions->PitchAlignment =
         pRestrictions->PitchAlignment << (pTexInfo->Format == GMM_FORMAT_YVU9) + 1;
    pRestrictions->RenderPitchAlignment = pRestrictions->RenderPitchAlignment;
    pRestrictions->LockPitchAlignment = pRestrictions->LockPitchAlignment;
    pRestrictions->MinPitch = pRestrictions->MinPitch;
  }
  uVar18 = uVar13 + 1 & 0xfffffffe;
  uVar13 = uVar14;
  if (((((((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->WaTable).field_0x9
        & 0x10) != 0) && (bVar6 = GmmIsYUVFormatLCUAligned(pTexInfo->Format), bVar6)) &&
     (uVar14 != 0)) {
    uVar13 = uVar14 + 0x3f & 0xffffffc0;
    uVar18 = (uVar13 - uVar14) + uVar18;
  }
  uVar16 = (ulong)pTexInfo->TileMode;
  if (((uint32_t *)((long)aVar11 + 0xa5c))[uVar16 * 8] != 0) {
    pPVar4 = ((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo;
    uVar2 = (pPVar4->Data).TileInfo[uVar16].LogicalTileWidth;
    uVar7 = (pPVar4->Data).TileInfo[uVar16].LogicalTileHeight;
    (pTexInfo->OffsetInfo).field_0.Plane.IsTileAlignedPlanes = true;
    iVar19 = uVar7 - 1;
    uVar8 = -uVar7;
    if ((char)local_34 == '\0') {
      uVar18 = (iVar19 + uVar13 & uVar8) + (uVar14 + iVar19 & uVar8);
    }
    else {
      uVar18 = iVar19 + uVar13 & uVar8;
    }
    if ((pTexInfo->Format == GMM_FORMAT_IMC4) || (pTexInfo->Format == GMM_FORMAT_IMC2)) {
      uVar14 = local_38;
      if (uVar2 != 0) {
        uVar14 = ((uVar2 - 1) + local_38) / uVar2;
      }
      if ((uVar14 & 1) != 0) {
        local_38 = (uVar14 + 1) * uVar2;
      }
    }
    uVar18 = uVar18 + ((uVar7 - 1) + uVar17 & uVar8);
    aVar12 = (pTexInfo->Flags).Info;
    if (((ulong)aVar12 & 0x6000000000) != 0) {
      (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)((ulong)aVar12 | 0x10000000);
    }
  }
  aVar3 = (pTexInfo->Flags).Gpu;
  if (((~(ulong)aVar3 & 0x2000010000) == 0) && (((pTexInfo->Flags).Info.field_0x4 & 0x10) != 0)) {
    uVar7 = (((this->super_GmmGen9TextureCalc).super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo->
            Data).TileInfo[uVar16].LogicalTileHeight;
    uVar18 = ((uVar7 - 1) + uVar13 & -uVar7) + ((uVar7 - 1) + uVar17 & -uVar7);
  }
  if ((((int)*(GFXCORE_FAMILY *)((long)aVar11 + 0xc) < 0xe) &&
      (aVar12 = (pTexInfo->Flags).Info, ((ulong)aVar12 & 0x7000000000) != 0)) &&
     ((uVar16 = (ulong)pTexInfo->BitsPerPixel * pTexInfo->BaseWidth, 0x1ffff < uVar16 ||
      ((pTexInfo->Format == GMM_FORMAT_NV12 &&
       (0xfbff < uVar16 && ((ulong)aVar12 & 0x2000000000) != 0)))))) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar3 & 0xfffffffffffeffff);
  }
  if (((pTexInfo->Flags).Info.field_0x3 & 0x10) != 0) {
    GmmTextureCalc::RedescribeTexturePlanes((GmmTextureCalc *)this,pTexInfo,&local_38);
  }
  GVar9 = GmmTextureCalc::FillTexPitchAndSize
                    ((GmmTextureCalc *)this,pTexInfo,(ulong)local_38,uVar18,pRestrictions);
  if (GVar9 == GMM_SUCCESS) {
    GmmTextureCalc::FillPlanarOffsetAddress((GmmTextureCalc *)this,pTexInfo);
  }
  GVar10 = GVar9;
  if (1 < (ulong)pTexInfo->ArraySize) {
    GVar15 = (ulong)pTexInfo->ArraySize * pTexInfo->Size;
    GVar10 = GMM_ERROR;
    if (GVar15 - *(int64_t *)((long)aVar11 + 14000) == 0 ||
        (long)GVar15 < *(int64_t *)((long)aVar11 + 14000)) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = pTexInfo->Size;
      pTexInfo->Size = GVar15;
      GVar10 = GVar9;
    }
  }
  return GVar10;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen10TextureCalc::FillTexPlanar(GMM_TEXTURE_INFO * pTexInfo,
                                                                  __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   WidthBytesPhysical, Height, YHeight, VHeight;
    uint32_t   AdjustedVHeight = 0;
    GMM_STATUS Status;
    bool       UVPacked = false;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(!pTexInfo->Flags.Info.TiledW);
    pTexInfo->TileMode = TILE_NONE;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    WidthBytesPhysical = GFX_ULONG_CAST(pTexInfo->BaseWidth) * pTexInfo->BitsPerPixel >> 3;
    Height = VHeight = 0;

    YHeight = pTexInfo->BaseHeight;

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1: // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420:  // Same as IMC3.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUUUUUU
                                          // UUUUUUUU
                                          // VVVVVVVV
                                          // VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height = YHeight + 2 * VHeight; // One VHeight for V and one for U.

                pTexInfo->OffsetInfo.Plane.NoOfPlanes = 3;

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //UUUUUUUU
                                               //VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height = YHeight + 2 * VHeight;

                pTexInfo->OffsetInfo.Plane.NoOfPlanes = 3;

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411:  // Similar to IMC3 but U/V are quarter width and full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UU
                                          // UU
                                          // UU
                                          // UU
                                          // VV
                                          // VV
                                          // VV
                                          // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height = YHeight + 2 * VHeight;

                pTexInfo->OffsetInfo.Plane.NoOfPlanes = 3;

                break;
            }
        case GMM_FORMAT_IMC2: // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            VHeight = GFX_CEIL_DIV(YHeight, 2);

            WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.

            Height = YHeight + VHeight;

            // With SURFACE_STATE.XOffset support, the U-V interface has
            // much lighter restrictions--which will be naturally met by
            // surface pitch restrictions (i.e. dividing an IMC2/4 pitch
            // by 2--to get the U/V interface--will always produce a safe
            // XOffset value).

            // Not technically UV packed but sizing works out the same
            // if the resource is std swizzled
            UVPacked                              = true;
            pTexInfo->OffsetInfo.Plane.NoOfPlanes = 2;

            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(YHeight, 2); // U/V plane half of Y
                Height  = YHeight + VHeight;
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
                Height  = YHeight + VHeight;
            }

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016) ||
               (pTexInfo->Format == GMM_FORMAT_P208) ||
               (pTexInfo->Format == GMM_FORMAT_P216))
            {
                WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.
            }
            else //if(pTexInfo->Format == GMM_FORMAT_NV11)
            {
                // Tiling not supported, since YPitch != UVPitch...
                pTexInfo->Flags.Info.TiledY  = 0;
                pTexInfo->Flags.Info.TiledYf = 0;
                pTexInfo->Flags.Info.TiledYs = 0;
                pTexInfo->Flags.Info.TiledX  = 0;
                pTexInfo->Flags.Info.Linear  = 1;
            }

            UVPacked                              = true;
            pTexInfo->OffsetInfo.Plane.NoOfPlanes = 2;
            break;
        }
        case GMM_FORMAT_I420: // IYUV & I420: are identical to YV12 except,
        case GMM_FORMAT_IYUV: // U & V pl.s are reversed.
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, UVSize, YVSizeRShift;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = WidthBytesPhysical * YHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(WidthBytesPhysical, YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(YHeight, YSizeForUVPurposesDimensionalAlignment);

            UVSize = 2 * // <-- U + V
                     (YSizeForUVPurposes >> YVSizeRShift);

            Height = GFX_CEIL_DIV(YSize + UVSize, WidthBytesPhysical);

            // Tiling not supported, since YPitch != UVPitch...
            pTexInfo->Flags.Info.TiledY  = 0;
            pTexInfo->Flags.Info.TiledYf = 0;
            pTexInfo->Flags.Info.TiledYs = 0;
            pTexInfo->Flags.Info.TiledX  = 0;
            pTexInfo->Flags.Info.Linear  = 1;

            pTexInfo->OffsetInfo.Plane.NoOfPlanes = 1;
            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unexpected format");
            return GMM_ERROR;
        }
    }

    // Align Height to even row to avoid hang if HW over-fetch
    Height = GFX_ALIGN(Height, __GMM_EVEN_ROW);

    SetTileMode(pTexInfo);

    // MMC is not supported for linear formats.
    if(pTexInfo->Flags.Gpu.MMC)
    {
        if(!(pTexInfo->Flags.Info.TiledY || pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
        {
            pTexInfo->Flags.Gpu.MMC = 0;
        }
    }

    // Legacy Planar "Linear Video" Restrictions...
    if(pTexInfo->Flags.Info.Linear && !pTexInfo->Flags.Wa.NoLegacyPlanarLinearVideoRestrictions)
    {
        pRestrictions->LockPitchAlignment   = GFX_MAX(pRestrictions->LockPitchAlignment, GMM_BYTES(64));
        pRestrictions->MinPitch             = GFX_MAX(pRestrictions->MinPitch, GMM_BYTES(64));
        pRestrictions->PitchAlignment       = GFX_MAX(pRestrictions->PitchAlignment, GMM_BYTES(64));
        pRestrictions->RenderPitchAlignment = GFX_MAX(pRestrictions->RenderPitchAlignment, GMM_BYTES(64));
    }

    // Multiply overall pitch alignment for surfaces whose U/V planes have a
    // pitch down-scaled from that of Y--Since the U/V pitches must meet the
    // original restriction, the Y pitch must meet a scaled-up multiple.
    if((pTexInfo->Format == GMM_FORMAT_I420) ||
       (pTexInfo->Format == GMM_FORMAT_IYUV) ||
       (pTexInfo->Format == GMM_FORMAT_NV11) ||
       (pTexInfo->Format == GMM_FORMAT_YV12) ||
       (pTexInfo->Format == GMM_FORMAT_YVU9))
    {
        uint32_t LShift =
        (pTexInfo->Format != GMM_FORMAT_YVU9) ?
        1 : // UVPitch = 1/2 YPitch
        2;  // UVPitch = 1/4 YPitch

        pRestrictions->LockPitchAlignment <<= LShift;
        pRestrictions->MinPitch <<= LShift;
        pRestrictions->PitchAlignment <<= LShift;
        pRestrictions->RenderPitchAlignment <<= LShift;
    }

    AdjustedVHeight = VHeight;
    // In case of Planar surfaces, only the last Plane has to be aligned to 64 for LCU access
    if(pGmmLibContext->GetWaTable().WaAlignYUVResourceToLCU && GmmIsYUVFormatLCUAligned(pTexInfo->Format) && VHeight > 0)
    {
        AdjustedVHeight = GFX_ALIGN(VHeight, GMM_SCANLINES(GMM_MAX_LCU_SIZE));
        Height += AdjustedVHeight - VHeight;
    }

    // For Tiled Planar surfaces, the planes must be tile-boundary aligned.
    // Actual alignment is handled in FillPlanarOffsetAddress, but height
    // and width must be adjusted for correct size calculation
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        uint32_t TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        pTexInfo->OffsetInfo.Plane.IsTileAlignedPlanes = true;

        //for separate U and V planes, use U plane unaligned and V plane aligned
        Height = GFX_ALIGN(YHeight, TileHeight) + (UVPacked ? GFX_ALIGN(AdjustedVHeight, TileHeight) :
                                                              (GFX_ALIGN(VHeight, TileHeight) + GFX_ALIGN(AdjustedVHeight, TileHeight)));

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
            // If the U & V planes are side-by-side then the surface pitch must be
            // padded out so that U and V planes will being on a tile boundary.
            // This means that an odd Y plane width must be padded out
            // with an additional tile. Even widths do not need padding
            uint32_t TileCols = GFX_CEIL_DIV(WidthBytesPhysical, TileWidth);
            if(TileCols % 2)
            {
                WidthBytesPhysical = (TileCols + 1) * TileWidth;
            }
        }

        if(pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)
        {
            pTexInfo->Flags.Info.RedecribedPlanes = true;
        }
    }

    // Vary wide planar tiled planar formats do not support MMC pre gen11. All formats do not support
    //Special case LKF MMC compressed surfaces
    if(pTexInfo->Flags.Gpu.MMC &&
       pTexInfo->Flags.Gpu.UnifiedAuxSurface &&
       pTexInfo->Flags.Info.TiledY)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;

        Height = GFX_ALIGN(YHeight, TileHeight) + GFX_ALIGN(AdjustedVHeight, TileHeight);
    }

    // Vary wide planar tiled planar formats do not support MMC pre gen11. All formats do not support
    // MMC above 16k bytes wide, while Yf NV12 does not support above 8k - 128 bytes.
    if((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) <= IGFX_GEN10_CORE) &&
       (pTexInfo->Flags.Info.TiledY || pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
    {
        if(((pTexInfo->BaseWidth * pTexInfo->BitsPerPixel / 8) >= GMM_KBYTE(16)) ||
           (pTexInfo->Format == GMM_FORMAT_NV12 && pTexInfo->Flags.Info.TiledYf &&
            (pTexInfo->BaseWidth * pTexInfo->BitsPerPixel / 8) >= (GMM_KBYTE(8) - 128)))
        {
            pTexInfo->Flags.Gpu.MMC = 0;
        }
    }
    
    if(pTexInfo->Flags.Info.RedecribedPlanes)
    {
        if(false == RedescribeTexturePlanes(pTexInfo, &WidthBytesPhysical))
        {
            __GMM_ASSERT(false);
        }
    }

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Height, pRestrictions)) == GMM_SUCCESS)
    {
        FillPlanarOffsetAddress(pTexInfo);
    }

    // Planar & hybrid 2D arrays supported in DX11.1+ spec but not HW. Memory layout
    // is defined by SW requirements; Y plane must be 4KB aligned.
    if(pTexInfo->ArraySize > 1)
    {
        GMM_GFX_SIZE_T ElementSizeBytes = pTexInfo->Size;
        int64_t        LargeSize;

        // Size should always be page aligned.
        __GMM_ASSERT((pTexInfo->Size % PAGE_SIZE) == 0);

        if((LargeSize = (int64_t)ElementSizeBytes * pTexInfo->ArraySize) <= pPlatform->SurfaceMaxSize)
        {
            pTexInfo->OffsetInfo.Plane.ArrayQPitch = ElementSizeBytes;
            pTexInfo->Size                         = LargeSize;
        }
        else
        {
            GMM_ASSERTDPF(0, "Surface too large!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return (Status);
}